

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

SyntaxKind slang::syntax::SyntaxFacts::getModuleHeaderKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0xda) {
    if (iVar1 == 0xc9) {
      return InterfaceHeader;
    }
    if (iVar1 == 0xd6) {
      return ModuleHeader;
    }
  }
  else {
    if (iVar1 == 0xda) {
      return ModuleHeader;
    }
    if (iVar1 == 0xe9) {
      return PackageHeader;
    }
    if (iVar1 == 0xf0) {
      return ProgramHeader;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleHeaderKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramHeader;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceHeader;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageHeader;
        default: return SyntaxKind::Unknown;
    }
}